

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temper.cpp
# Opt level: O2

void processFile(MidiFile *midifile,Options *options)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  MidiEventList *pMVar4;
  MidiEvent *this;
  int extraout_EDX;
  int extraout_EDX_00;
  int e;
  int iVar5;
  allocator local_69;
  string local_68;
  string temperament;
  
  smf::MidiFile::joinTracks(midifile);
  iVar5 = 0;
  while( true ) {
    pMVar4 = smf::MidiFile::operator[](midifile,0);
    iVar3 = smf::MidiEventList::getEventCount(pMVar4);
    if (iVar3 <= iVar5) break;
    pMVar4 = smf::MidiFile::operator[](midifile,0);
    this = smf::MidiEventList::operator[](pMVar4,iVar5);
    bVar2 = smf::MidiMessage::isPatchChange(&this->super_MidiMessage);
    if ((bVar2) &&
       (puVar1 = (this->super_MidiMessage).
                 super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
       (this->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish != puVar1)) {
      (this->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    bVar2 = smf::MidiMessage::isNote(&this->super_MidiMessage);
    if (bVar2) {
      iVar3 = smf::MidiMessage::getChannel(&this->super_MidiMessage);
      if (iVar3 != 9) {
        iVar3 = smf::MidiMessage::getKeyNumber(&this->super_MidiMessage);
        smf::MidiMessage::setChannel(&this->super_MidiMessage,(uint)(8 < iVar3 % 0xc) + iVar3 % 0xc)
        ;
      }
    }
    iVar5 = iVar5 + 1;
  }
  std::__cxx11::string::string((string *)&temperament,"type-0",(allocator *)&local_68);
  bVar2 = smf::Options::getBoolean(options,&temperament);
  std::__cxx11::string::~string((string *)&temperament);
  if (!bVar2) {
    smf::MidiFile::splitTracks(midifile);
  }
  removeInstruments(midifile);
  std::__cxx11::string::string((string *)&temperament,"instrument",(allocator *)&local_68);
  iVar5 = smf::Options::getInteger(options,&temperament);
  std::__cxx11::string::~string((string *)&temperament);
  applyInstrument(midifile,iVar5);
  std::__cxx11::string::string((string *)&temperament,"base-pitch-class",(allocator *)&local_68);
  smf::Options::getInteger(options,&temperament);
  std::__cxx11::string::~string((string *)&temperament);
  std::__cxx11::string::string((string *)&local_68,"temperament",&local_69);
  smf::Options::getString(&temperament,options,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"pythagorean",&local_69);
  bVar2 = smf::Options::getBoolean(options,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar2) {
    std::__cxx11::string::assign((char *)&temperament);
  }
  std::__cxx11::string::string((string *)&local_68,"meantone",&local_69);
  bVar2 = smf::Options::getBoolean(options,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar2) {
    std::__cxx11::string::assign((char *)&temperament);
  }
  std::__cxx11::string::string((string *)&local_68,"kirnberger3",&local_69);
  bVar2 = smf::Options::getBoolean(options,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar2) {
    std::__cxx11::string::assign((char *)&temperament);
  }
  std::__cxx11::string::string((string *)&local_68,"valotti",&local_69);
  bVar2 = smf::Options::getBoolean(options,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar2) {
    std::__cxx11::string::assign((char *)&temperament);
  }
  std::__cxx11::string::string((string *)&local_68,"bad",&local_69);
  bVar2 = smf::Options::getBoolean(options,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar2) {
    std::__cxx11::string::assign((char *)&temperament);
  }
  std::__cxx11::string::string((string *)&local_68,"weird",&local_69);
  bVar2 = smf::Options::getBoolean(options,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar2) {
    std::__cxx11::string::assign((char *)&temperament);
  }
  std::__cxx11::string::string((string *)&local_68,"equal",&local_69);
  bVar2 = smf::Options::getBoolean(options,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  iVar5 = extraout_EDX;
  if (bVar2) {
    std::__cxx11::string::assign((char *)&temperament);
    iVar5 = extraout_EDX_00;
  }
  applyTemperament(midifile,&temperament,iVar5);
  smf::MidiFile::sortTracksNoteOnsBeforeOffs(midifile);
  std::__cxx11::string::~string((string *)&temperament);
  return;
}

Assistant:

void processFile(MidiFile& midifile, Options& options) {
	midifile.joinTracks();
	for (int e=0; e<midifile[0].getEventCount(); e++) {
		MidiEvent *curNote = &midifile[0][e];
		if (curNote->isPatchChange()) {
			curNote->clear();
		}
		if (!curNote->isNote()) {
			continue;
		}
		int chan = curNote->getChannel();
		if (chan == 0x09) {
			// ignore drum track
			continue;
		}
		int pitch = curNote->getKeyNumber();
		int pc = pitch % 12;
		int newchan = (pc < 0x09) ? pc : pc + 1;
		curNote->setChannel(newchan);
	}

	if (!options.getBoolean("type-0")) {
		midifile.splitTracks();
	}

	removeInstruments(midifile);
	int instrumentCode = options.getInteger("instrument");
	applyInstrument(midifile, instrumentCode);

	int base = options.getInteger("base-pitch-class");
	if (base < 0) {
		base = 0;
	} else if (base > 11) {
		base = base % 12;
	}
	string temperament = options.getString("temperament");
	if (options.getBoolean("pythagorean")) {
		temperament = "pythagorean";
	}
	if (options.getBoolean("meantone")) {
		temperament = "meantone";
	}
	if (options.getBoolean("kirnberger3")) {
		temperament = "kirnberger3";
	}
	if (options.getBoolean("valotti")) {
		temperament = "valotti";
	}
	if (options.getBoolean("bad")) {
		temperament = "bad";
	}
	if (options.getBoolean("weird")) {
		temperament = "weird";
	}
	if (options.getBoolean("equal")) {
		temperament = "equal";
	}
	applyTemperament(midifile, temperament, base);

	midifile.sortTracks();
}